

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void openStatTable(Parse *pParse,int iDb,int iStatCur,char *zWhere,char *zWhereType)

{
  sqlite3 *db;
  Db *pDVar1;
  char *zDatabase;
  Vdbe *p;
  Table *pTVar2;
  u8 uVar3;
  int iTab;
  
  db = pParse->db;
  p = sqlite3GetVdbe(pParse);
  if (p != (Vdbe *)0x0) {
    pDVar1 = db->aDb;
    zDatabase = pDVar1[iDb].zName;
    pTVar2 = sqlite3FindTable(db,"sqlite_stat1",zDatabase);
    if (pTVar2 == (Table *)0x0) {
      sqlite3NestedParse(pParse,"CREATE TABLE %Q.%s(%s)",zDatabase,"sqlite_stat1","tbl,idx,stat");
      iTab = pParse->regRoot;
      uVar3 = '\x02';
    }
    else {
      iTab = pTVar2->tnum;
      sqlite3TableLock(pParse,iDb,iTab,'\x01',"sqlite_stat1");
      if (zWhere == (char *)0x0) {
        uVar3 = '\0';
        sqlite3VdbeAddOp3(p,0x67,iTab,iDb,0);
      }
      else {
        uVar3 = '\0';
        sqlite3NestedParse(pParse,"DELETE FROM %Q.%s WHERE %s=%Q",pDVar1[iDb].zName,"sqlite_stat1",
                           zWhereType);
      }
    }
    sqlite3VdbeAddOp3(p,0x28,iStatCur,iTab,iDb);
    sqlite3VdbeChangeP4(p,-1,(char *)0x3,-0xe);
    if (p->aOp != (Op *)0x0) {
      p->aOp[(long)p->nOp + -1].p5 = uVar3;
    }
  }
  return;
}

Assistant:

static void openStatTable(
  Parse *pParse,          /* Parsing context */
  int iDb,                /* The database we are looking in */
  int iStatCur,           /* Open the sqlite_stat1 table on this cursor */
  const char *zWhere,     /* Delete entries for this table or index */
  const char *zWhereType  /* Either "tbl" or "idx" */
){
  static const struct {
    const char *zName;
    const char *zCols;
  } aTable[] = {
    { "sqlite_stat1", "tbl,idx,stat" },
#ifdef SQLITE_ENABLE_STAT3
    { "sqlite_stat3", "tbl,idx,neq,nlt,ndlt,sample" },
#endif
  };

  int aRoot[] = {0, 0};
  u8 aCreateTbl[] = {0, 0};

  int i;
  sqlite3 *db = pParse->db;
  Db *pDb;
  Vdbe *v = sqlite3GetVdbe(pParse);
  if( v==0 ) return;
  assert( sqlite3BtreeHoldsAllMutexes(db) );
  assert( sqlite3VdbeDb(v)==db );
  pDb = &db->aDb[iDb];

  /* Create new statistic tables if they do not exist, or clear them
  ** if they do already exist.
  */
  for(i=0; i<ArraySize(aTable); i++){
    const char *zTab = aTable[i].zName;
    Table *pStat;
    if( (pStat = sqlite3FindTable(db, zTab, pDb->zName))==0 ){
      /* The sqlite_stat[12] table does not exist. Create it. Note that a 
      ** side-effect of the CREATE TABLE statement is to leave the rootpage 
      ** of the new table in register pParse->regRoot. This is important 
      ** because the OpenWrite opcode below will be needing it. */
      sqlite3NestedParse(pParse,
          "CREATE TABLE %Q.%s(%s)", pDb->zName, zTab, aTable[i].zCols
      );
      aRoot[i] = pParse->regRoot;
      aCreateTbl[i] = OPFLAG_P2ISREG;
    }else{
      /* The table already exists. If zWhere is not NULL, delete all entries 
      ** associated with the table zWhere. If zWhere is NULL, delete the
      ** entire contents of the table. */
      aRoot[i] = pStat->tnum;
      sqlite3TableLock(pParse, iDb, aRoot[i], 1, zTab);
      if( zWhere ){
        sqlite3NestedParse(pParse,
           "DELETE FROM %Q.%s WHERE %s=%Q", pDb->zName, zTab, zWhereType, zWhere
        );
      }else{
        /* The sqlite_stat[12] table already exists.  Delete all rows. */
        sqlite3VdbeAddOp2(v, OP_Clear, aRoot[i], iDb);
      }
    }
  }

  /* Open the sqlite_stat[13] tables for writing. */
  for(i=0; i<ArraySize(aTable); i++){
    sqlite3VdbeAddOp3(v, OP_OpenWrite, iStatCur+i, aRoot[i], iDb);
    sqlite3VdbeChangeP4(v, -1, (char *)3, P4_INT32);
    sqlite3VdbeChangeP5(v, aCreateTbl[i]);
  }
}